

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O2

void __thiscall
Js::JavascriptStackWalker::SetCurrentArgumentsObject(JavascriptStackWalker *this,Var args)

{
  if (this->interpreterFrame != (InterpreterStackFrame *)0x0) {
    *(Var *)(this->interpreterFrame + 0x40) = args;
    return;
  }
  if ((this->field_0x50 & 1) != 0) {
    InlinedFrameWalker::SetArgumentsObject(&this->inlinedFrameWalker,args);
    return;
  }
  SetCurrentNativeArgumentsObject(this,args);
  return;
}

Assistant:

void JavascriptStackWalker::SetCurrentArgumentsObject(Var args)
    {
#if ENABLE_NATIVE_CODEGEN
        if (interpreterFrame)
#else
        Assert(interpreterFrame);
#endif
        {
            interpreterFrame->SetArgumentsObject(args);
        }
#if ENABLE_NATIVE_CODEGEN
        else
        {
            if (inlinedFramesBeingWalked)
            {
                inlinedFrameWalker.SetArgumentsObject(args);
            }
            else
            {
                this->SetCurrentNativeArgumentsObject(args);
            }
        }
#endif
    }